

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SFormat.cpp
# Opt level: O2

void slang::SFormat::formatStrength(string *result,SVInt *value)

{
  logic_t lVar1;
  logic_error *this;
  bitwidth_t bVar2;
  allocator<char> local_f1;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  bVar2 = (value->super_SVIntStorage).bitWidth;
  while( true ) {
    if (bVar2 == 0) {
      return;
    }
    lVar1 = SVInt::operator[](value,bVar2 - 1);
    if ((((lVar1.value != '\0') && (lVar1.value != 0x80)) && (lVar1.value != '@')) &&
       (lVar1.value != '\x01')) break;
    std::__cxx11::string::append((char *)result);
    if (bVar2 != 1) {
      std::__cxx11::string::append((char *)result);
    }
    bVar2 = bVar2 - 1;
  }
  this = (logic_error *)__cxa_allocate_exception(0x10,"St0");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/text/SFormat.cpp"
             ,&local_f1);
  std::operator+(&local_b0,&local_d0,":");
  std::__cxx11::to_string(&local_f0,0x15a);
  std::operator+(&local_90,&local_b0,&local_f0);
  std::operator+(&local_70,&local_90,": ");
  std::operator+(&local_50,&local_70,"Default case should be unreachable!");
  std::logic_error::logic_error(this,(string *)&local_50);
  __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void formatStrength(std::string& result, const SVInt& value) {
    for (bitwidth_t i = value.getBitWidth(); i > 0; i--) {
        // At compile time it's impossible to know strength values so
        // we will always put "Strong" here, or "Hi" if it's high impedance.
        logic_t l = value[int32_t(i) - 1];
        switch (l.value) {
            case 0:
                result += "St0";
                break;
            case 1:
                result += "St1";
                break;
            case logic_t::X_VALUE:
                result += "StX";
                break;
            case logic_t::Z_VALUE:
                result += "HiZ";
                break;
            default:
                ASSUME_UNREACHABLE;
        }

        if (i != 1)
            result += " ";
    }
}